

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O1

void filemgr_prefetch(filemgr *file,filemgr_config *config,err_log_callback *log_callback)

{
  uint uVar1;
  uint64_t uVar2;
  undefined8 *__arg;
  bool bVar3;
  
  uVar2 = bcache_get_num_free_blocks();
  uVar1 = file->blocksize;
  pthread_spin_lock(&file->lock);
  if (((file->last_commit).super___atomic_base<unsigned_long>._M_i != 0) &&
     (0x3fffff < uVar2 * uVar1)) {
    __arg = (undefined8 *)calloc(1,0x20);
    *__arg = file;
    __arg[1] = config->prefetch_duration;
    __arg[2] = log_callback;
    LOCK();
    bVar3 = (file->prefetch_status).super___atomic_base<unsigned_char>._M_i == '\0';
    if (bVar3) {
      (file->prefetch_status).super___atomic_base<unsigned_char>._M_i = '\x01';
    }
    UNLOCK();
    if (bVar3) {
      pthread_create(&file->prefetch_tid,(pthread_attr_t *)0x0,_filemgr_prefetch_thread,__arg);
    }
  }
  pthread_spin_unlock(&file->lock);
  return;
}

Assistant:

void filemgr_prefetch(struct filemgr *file,
                      struct filemgr_config *config,
                      err_log_callback *log_callback)
{
    uint64_t bcache_free_space;

    bcache_free_space = bcache_get_num_free_blocks();
    bcache_free_space *= file->blocksize;

    // block cache should have free space larger than FILEMGR_PREFETCH_UNIT
    spin_lock(&file->lock);
    if (atomic_get_uint64_t(&file->last_commit) > 0 &&
        bcache_free_space >= FILEMGR_PREFETCH_UNIT) {
        // invoke prefetch thread
        struct filemgr_prefetch_args *args;
        args = (struct filemgr_prefetch_args *)
               calloc(1, sizeof(struct filemgr_prefetch_args));
        args->file = file;
        args->duration = config->prefetch_duration;
        args->log_callback = log_callback;

        if (atomic_cas_uint8_t(&file->prefetch_status, FILEMGR_PREFETCH_IDLE,
                               FILEMGR_PREFETCH_RUNNING)) {
            thread_create(&file->prefetch_tid, _filemgr_prefetch_thread, args);
        }
    }
    spin_unlock(&file->lock);
}